

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

void uv::TCPClient::AfterConnect(uv_connect_t *handle,int status)

{
  char *pcVar1;
  TCPClient *this;
  long lVar2;
  int iVar3;
  CStringStream *pCVar4;
  ILog4zManager *pIVar5;
  long *in_FS_OFFSET;
  CStringStream ss;
  string local_68;
  string local_48;
  
  this = *(TCPClient **)((long)handle->handle->data + 0x1d8);
  if (status == 0) {
    iVar3 = uv_read_start(handle->handle,AllocBufferForRecv,AfterRecv);
    if (iVar3 == 0) {
      this->connectstatus_ = 1;
      ss.m_pEnd = (char *)*in_FS_OFFSET;
      pcVar1 = ss.m_pEnd + -0x800;
      ss.m_pBegin = pcVar1;
      ss.m_pCur = pcVar1;
      pCVar4 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,this);
      zsummer::log4z::CStringStream::operator<<(pCVar4,")run");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar4,0x122);
      pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,1,pcVar1);
    }
    else {
      GetUVError_abi_cxx11_((string *)&ss,0);
      std::__cxx11::string::operator=((string *)&this->errmsg_,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      ss.m_pEnd = (char *)*in_FS_OFFSET;
      pcVar1 = ss.m_pEnd + -0x800;
      ss.m_pBegin = pcVar1;
      ss.m_pCur = pcVar1;
      pCVar4 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,this);
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,") uv_read_start error:");
      std::__cxx11::string::string((string *)&local_68,(string *)&this->errmsg_);
      zsummer::log4z::CStringStream::operator<<(pCVar4,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      pCVar4 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ");
      pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar4,0x11d);
      pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,pcVar1);
      fprintf(_stdout,"uv_read_start error:%s\n",(this->errmsg_)._M_dataplus._M_p);
      this->connectstatus_ = 2;
    }
    if (this->isreconnecting_ == true) {
      fwrite("reconnect succeed\n",0x12,1,_stdout);
      StopReconnect(this);
      if (this->reconnectcb_ != (ReconnectCB)0x0) {
        (*this->reconnectcb_)(NET_EVENT_TYPE_RECONNECT,this->reconnect_userdata_);
      }
    }
  }
  else {
    this->connectstatus_ = 2;
    GetUVError_abi_cxx11_((string *)&ss,status);
    std::__cxx11::string::operator=((string *)&this->errmsg_,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    ss.m_pEnd = (char *)*in_FS_OFFSET;
    pcVar1 = ss.m_pEnd + -0x800;
    ss.m_pBegin = pcVar1;
    ss.m_pCur = pcVar1;
    pCVar4 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,this);
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4,") connect error:");
    std::__cxx11::string::string((string *)&local_48,(string *)&this->errmsg_);
    zsummer::log4z::CStringStream::operator<<(pCVar4,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pCVar4 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ");
    pCVar4 = zsummer::log4z::CStringStream::operator<<(pCVar4," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar4,0x110);
    pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,pcVar1);
    fprintf(_stdout,"connect error:%s\n",(this->errmsg_)._M_dataplus._M_p);
    if (this->isreconnecting_ == true) {
      uv_timer_stop(&this->reconnect_timer_);
      lVar2 = this->repeat_time_ * 2;
      this->repeat_time_ = lVar2;
      uv_timer_start(&this->reconnect_timer_,ReconnectTimer,lVar2);
    }
  }
  return;
}

Assistant:

void TCPClient::AfterConnect(uv_connect_t* handle, int status)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->handle->data;
    TCPClient* parent = (TCPClient*)theclass->parent_server;
    if (status) {
        parent->connectstatus_ = CONNECT_ERROR;
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") connect error:" << parent->errmsg_);
        fprintf(stdout, "connect error:%s\n", parent->errmsg_.c_str());
        if (parent->isreconnecting_) {//reconnect failure, restart timer to trigger reconnect.
            uv_timer_stop(&parent->reconnect_timer_);
            parent->repeat_time_ *= 2;
            uv_timer_start(&parent->reconnect_timer_, TCPClient::ReconnectTimer, parent->repeat_time_, parent->repeat_time_);
        }
        return;
    }

    int iret = uv_read_start(handle->handle, AllocBufferForRecv, AfterRecv);
    if (iret) {
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") uv_read_start error:" << parent->errmsg_);
        fprintf(stdout, "uv_read_start error:%s\n", parent->errmsg_.c_str());
        parent->connectstatus_ = CONNECT_ERROR;
    } else {
        parent->connectstatus_ = CONNECT_FINISH;
        LOGI("client(" << parent << ")run");
    }
    if (parent->isreconnecting_) {
        fprintf(stdout, "reconnect succeed\n");
        parent->StopReconnect();//reconnect succeed.
        if (parent->reconnectcb_) {
            parent->reconnectcb_(NET_EVENT_TYPE_RECONNECT, parent->reconnect_userdata_);
        }
    }
}